

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_map_custom3_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c,ggml_custom3_op_t fun,
          int n_tasks,void *userdata,_Bool inplace)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  char *file;
  
  if (n_tasks < 1 && n_tasks != -1) {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar2 = "n_tasks == GGML_N_TASKS_MAX || n_tasks > 0";
    line = 0x1380;
  }
  else {
    if (inplace) {
      pgVar1 = ggml_view_tensor(ctx,a);
    }
    else {
      pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
    }
    if (pgVar1 != (ggml_tensor *)0x0) {
      *(ggml_custom3_op_t *)pgVar1->op_params = fun;
      pgVar1->op_params[2] = n_tasks;
      *(void **)(pgVar1->op_params + 4) = userdata;
      pgVar1->op = GGML_OP_MAP_CUSTOM3;
      pgVar1->src[0] = a;
      pgVar1->src[1] = b;
      pgVar1->src[2] = c;
      return pgVar1;
    }
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
    pcVar2 = "tensor != NULL";
    line = 0x70;
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

static struct ggml_tensor * ggml_map_custom3_impl(
        struct ggml_context      * ctx,
        struct ggml_tensor       * a,
        struct ggml_tensor       * b,
        struct ggml_tensor       * c,
        const  ggml_custom3_op_t   fun,
        int                        n_tasks,
        void                     * userdata,
        bool                       inplace) {
    GGML_ASSERT(n_tasks == GGML_N_TASKS_MAX || n_tasks > 0);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    struct ggml_map_custom3_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op     = GGML_OP_MAP_CUSTOM3;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}